

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O3

void __thiscall
UnscentedKalmanFilter_computeSigmaPoints_Test::TestBody
          (UnscentedKalmanFilter_computeSigmaPoints_Test *this)

{
  bool bVar1;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this_00;
  char *pcVar2;
  char *in_R9;
  UnscentedKalmanFilter<Kalman::Vector<float,_3>_> local_130;
  AssertHelper local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  Message local_38;
  AssertionResult gtest_ar_;
  
  local_130.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.alpha = 1.0;
  local_130.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.beta = 2.0;
  local_130.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.kappa = 1.0;
  Kalman::UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>::computeWeights
            (&local_130.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>);
  local_130.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
  super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.super_Matrix<float,_3,_1>.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_130.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
  super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.super_Matrix<float,_3,_1>.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  local_130.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma = 2.0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_130.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
  super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.super_Matrix<float,_3,_1>.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 1.0;
  local_38.ss_.ptr_._0_4_ = 0x40000000;
  local_58 = (undefined1  [8])&local_130;
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                      ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_58,
                       (Scalar *)&local_38);
  gtest_ar_.message_.ptr_._0_4_ = 0x40400000;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
            (this_00,(Scalar *)&gtest_ar_.message_);
  if ((gtest_ar._0_8_ == 2) &&
     (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1)) {
    local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
    super_StandardBase<Kalman::Vector<float,_3>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
    super_StandardBase<Kalman::Vector<float,_3>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
    super_StandardBase<Kalman::Vector<float,_3>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
    super_StandardBase<Kalman::Vector<float,_3>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
    super_StandardBase<Kalman::Vector<float,_3>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
    local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
    super_StandardBase<Kalman::Vector<float,_3>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
    local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
    super_StandardBase<Kalman::Vector<float,_3>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
    local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
    super_StandardBase<Kalman::Vector<float,_3>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
    local_130.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
    super_StandardBase<Kalman::Vector<float,_3>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
    bVar1 = Kalman::UnscentedKalmanFilter<Kalman::Vector<float,_3>_>::computeSigmaPoints(&local_130)
    ;
    local_38.ss_.ptr_._0_4_ = CONCAT31(local_38.ss_.ptr_._1_3_,bVar1);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (bVar1) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)local_58,"1","ukf.sigmaStatePoints(0,0)",1.0,
                 local_130.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                 sigmaStatePoints.super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.
                 m_storage.m_data.array[0]);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message(&local_38);
        if (gtest_ar._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                   ,0x21,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
        if (CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperFloatingPointEQ<float>
                  ((internal *)local_58,"2","ukf.sigmaStatePoints(1,0)",2.0,
                   local_130.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                   sigmaStatePoints.super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.
                   m_storage.m_data.array[1]);
        if (local_58[0] == (internal)0x0) {
          testing::Message::Message(&local_38);
          if (gtest_ar._0_8_ == 0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                     ,0x22,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_38);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
          if (CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != 0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               ((long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) + 8))
                        ();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_58,"3","ukf.sigmaStatePoints(2,0)",3.0,
                     local_130.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                     sigmaStatePoints.super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.
                     m_storage.m_data.array[2]);
          if (local_58[0] == (internal)0x0) {
            testing::Message::Message(&local_38);
            if (gtest_ar._0_8_ == 0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                       ,0x23,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_.message_,&local_38);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
            if (CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != 0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) &&
                 ((long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)local_58,"3","ukf.sigmaStatePoints(0,1)",3.0,
                       local_130.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                       sigmaStatePoints.super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.
                       m_storage.m_data.array[3]);
            if (local_58[0] == (internal)0x0) {
              testing::Message::Message(&local_38);
              if (gtest_ar._0_8_ == 0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                         ,0x26,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_.message_,&local_38);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
              if (CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != 0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) &&
                   ((long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != (long *)0x0
                   )) {
                  (**(code **)(*(long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) +
                              8))();
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)local_58,"4","ukf.sigmaStatePoints(1,2)",4.0,
                         local_130.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                         sigmaStatePoints.
                         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.
                         m_data.array[7]);
              if (local_58[0] == (internal)0x0) {
                testing::Message::Message(&local_38);
                if (gtest_ar._0_8_ == 0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = *(char **)gtest_ar._0_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                           ,0x27,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_.message_,&local_38);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
                if (CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != 0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) &&
                     ((long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) !=
                      (long *)0x0)) {
                    (**(code **)(*(long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_)
                                + 8))();
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                testing::internal::CmpHelperFloatingPointEQ<float>
                          ((internal *)local_58,"5","ukf.sigmaStatePoints(2,3)",5.0,
                           local_130.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                           sigmaStatePoints.
                           super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.
                           m_data.array[0xb]);
                if (local_58[0] == (internal)0x0) {
                  testing::Message::Message(&local_38);
                  if (gtest_ar._0_8_ == 0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = *(char **)gtest_ar._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                             ,0x28,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_.message_,&local_38);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_);
                  if (CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != 0) {
                    bVar1 = testing::internal::IsTrue(true);
                    if ((bVar1) &&
                       ((long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) !=
                        (long *)0x0)) {
                      (**(code **)(*(long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_
                                                    ) + 8))();
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_58,"-1","ukf.sigmaStatePoints(0,4)",-1.0,
                             local_130.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                             sigmaStatePoints.
                             super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.
                             m_data.array[0xc]);
                  if (local_58[0] == (internal)0x0) {
                    testing::Message::Message(&local_38);
                    if (gtest_ar._0_8_ == 0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = *(char **)gtest_ar._0_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                               ,0x2b,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_.message_,&local_38);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_.message_);
                    if (CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != 0) {
                      bVar1 = testing::internal::IsTrue(true);
                      if ((bVar1) &&
                         ((long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) !=
                          (long *)0x0)) {
                        (**(code **)(*(long *)CONCAT44(local_38.ss_.ptr_._4_4_,
                                                       local_38.ss_.ptr_._0_4_) + 8))();
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    testing::internal::CmpHelperFloatingPointEQ<float>
                              ((internal *)local_58,"0","ukf.sigmaStatePoints(1,5)",0.0,
                               local_130.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                               sigmaStatePoints.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage
                               .m_data.array[0x10]);
                    if (local_58[0] == (internal)0x0) {
                      testing::Message::Message(&local_38);
                      if (gtest_ar._0_8_ == 0) {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = *(char **)gtest_ar._0_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                                 ,0x2c,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_.message_,&local_38);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_.message_);
                      if (CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != 0) {
                        bVar1 = testing::internal::IsTrue(true);
                        if ((bVar1) &&
                           ((long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) !=
                            (long *)0x0)) {
                          (**(code **)(*(long *)CONCAT44(local_38.ss_.ptr_._4_4_,
                                                         local_38.ss_.ptr_._0_4_) + 8))();
                        }
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                      testing::internal::CmpHelperFloatingPointEQ<float>
                                ((internal *)local_58,"1","ukf.sigmaStatePoints(2,6)",1.0,
                                 local_130.
                                 super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                 sigmaStatePoints.
                                 super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.
                                 m_storage.m_data.array[0x14]);
                      if (local_58[0] == (internal)0x0) {
                        testing::Message::Message(&local_38);
                        if (gtest_ar._0_8_ == 0) {
                          pcVar2 = "";
                        }
                        else {
                          pcVar2 = *(char **)gtest_ar._0_8_;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                                   ,0x2d,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_.message_,&local_38);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_.message_);
                        if (CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != 0) {
                          bVar1 = testing::internal::IsTrue(true);
                          if ((bVar1) &&
                             ((long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) !=
                              (long *)0x0)) {
                            (**(code **)(*(long *)CONCAT44(local_38.ss_.ptr_._4_4_,
                                                           local_38.ss_.ptr_._0_4_) + 8))();
                          }
                        }
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      testing::Message::Message((Message *)&gtest_ar_.message_);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_58,(internal *)&local_38,
                 (AssertionResult *)"ukf.computeSigmaPoints()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                 ,0x1f,(char *)local_58);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_.message_);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_58 != (undefined1  [8])&gtest_ar.message_) {
        operator_delete((void *)local_58);
      }
      if (CONCAT44(gtest_ar_.message_.ptr_._4_4_,gtest_ar_.message_.ptr_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar_.message_.ptr_._4_4_,gtest_ar_.message_.ptr_._0_4_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_.message_.ptr_._4_4_,gtest_ar_.message_.ptr_._0_4_
                                        ) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    return;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 1>>::finished() [MatrixType = Eigen::Matrix<float, 3, 1>]"
               );
}

Assistant:

TEST(UnscentedKalmanFilter, computeSigmaPoints) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = UnscentedKalmanFilter<Vector<T, 3>>(alpha,beta,kappa);
    
    // Init variables
    ukf.gamma = 2;
    ukf.x << 1.f, 2.f, 3.f;
    ukf.P.setIdentity();
    
    ASSERT_TRUE(ukf.computeSigmaPoints());
    
    ASSERT_FLOAT_EQ(1, ukf.sigmaStatePoints(0,0));
    ASSERT_FLOAT_EQ(2, ukf.sigmaStatePoints(1,0));
    ASSERT_FLOAT_EQ(3, ukf.sigmaStatePoints(2,0));
    
    // Center block diagonal
    ASSERT_FLOAT_EQ(3, ukf.sigmaStatePoints(0,1));
    ASSERT_FLOAT_EQ(4, ukf.sigmaStatePoints(1,2));
    ASSERT_FLOAT_EQ(5, ukf.sigmaStatePoints(2,3));
    
    // Right block diagonal
    ASSERT_FLOAT_EQ(-1, ukf.sigmaStatePoints(0,4));
    ASSERT_FLOAT_EQ(0,  ukf.sigmaStatePoints(1,5));
    ASSERT_FLOAT_EQ(1,  ukf.sigmaStatePoints(2,6));
}